

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combine_access_chains.cpp
# Opt level: O0

Type * __thiscall
spvtools::opt::CombineAccessChains::GetIndexedType(CombineAccessChains *this,Instruction *inst)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  Op opcode;
  IRContext *pIVar5;
  DefUseManager *this_00;
  TypeManager *this_01;
  Instruction *this_02;
  undefined4 extraout_var;
  Pointer *this_03;
  ConstantManager *this_04;
  Type *pTVar6;
  value_type_conflict local_70;
  uint32_t local_6c;
  Constant *pCStack_68;
  uint32_t index_value;
  Constant *index_constant;
  Instruction *index_inst;
  uint32_t i;
  uint32_t starting_index;
  vector<unsigned_int,_std::allocator<unsigned_int>_> element_indices;
  Type *type;
  Instruction *base_ptr;
  TypeManager *type_mgr;
  DefUseManager *def_use_mgr;
  Instruction *inst_local;
  CombineAccessChains *this_local;
  
  pIVar5 = Pass::context(&this->super_Pass);
  this_00 = IRContext::get_def_use_mgr(pIVar5);
  pIVar5 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_type_mgr(pIVar5);
  uVar3 = opt::Instruction::GetSingleWordInOperand(inst,0);
  this_02 = analysis::DefUseManager::GetDef(this_00,uVar3);
  uVar3 = opt::Instruction::type_id(this_02);
  element_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)analysis::TypeManager::GetType(this_01,uVar3)
  ;
  iVar4 = (*((Type *)element_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->_vptr_Type[0x22])();
  if (CONCAT44(extraout_var,iVar4) == 0) {
    __assert_fail("type->AsPointer()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/combine_access_chains.cpp"
                  ,0x62,
                  "const analysis::Type *spvtools::opt::CombineAccessChains::GetIndexedType(Instruction *)"
                 );
  }
  this_03 = (Pointer *)
            (**(code **)(*(long *)element_indices.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 0x110))();
  element_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)analysis::Pointer::pointee_type(this_03);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  index_inst._4_4_ = 1;
  opcode = opt::Instruction::opcode(inst);
  bVar2 = IsPtrAccessChain(this,opcode);
  if (bVar2) {
    index_inst._4_4_ = 2;
  }
  for (index_inst._0_4_ = index_inst._4_4_; uVar1 = (uint)index_inst,
      uVar3 = opt::Instruction::NumInOperands(inst), uVar1 < uVar3;
      index_inst._0_4_ = (uint)index_inst + 1) {
    uVar3 = opt::Instruction::GetSingleWordInOperand(inst,(uint)index_inst);
    index_constant = (Constant *)analysis::DefUseManager::GetDef(this_00,uVar3);
    pIVar5 = Pass::context(&this->super_Pass);
    this_04 = IRContext::get_constant_mgr(pIVar5);
    pCStack_68 = analysis::ConstantManager::GetConstantFromInst
                           (this_04,(Instruction *)index_constant);
    if (pCStack_68 == (Constant *)0x0) {
      local_70 = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,&local_70);
    }
    else {
      local_6c = GetConstantValue(this,pCStack_68);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,&local_6c);
    }
  }
  pTVar6 = analysis::TypeManager::GetMemberType
                     (this_01,(Type *)element_indices.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  element_indices.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pTVar6;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  return pTVar6;
}

Assistant:

const analysis::Type* CombineAccessChains::GetIndexedType(Instruction* inst) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();

  Instruction* base_ptr = def_use_mgr->GetDef(inst->GetSingleWordInOperand(0));
  const analysis::Type* type = type_mgr->GetType(base_ptr->type_id());
  assert(type->AsPointer());
  type = type->AsPointer()->pointee_type();
  std::vector<uint32_t> element_indices;
  uint32_t starting_index = 1;
  if (IsPtrAccessChain(inst->opcode())) {
    // Skip the first index of OpPtrAccessChain as it does not affect type
    // resolution.
    starting_index = 2;
  }
  for (uint32_t i = starting_index; i < inst->NumInOperands(); ++i) {
    Instruction* index_inst =
        def_use_mgr->GetDef(inst->GetSingleWordInOperand(i));
    const analysis::Constant* index_constant =
        context()->get_constant_mgr()->GetConstantFromInst(index_inst);
    if (index_constant) {
      uint32_t index_value = GetConstantValue(index_constant);
      element_indices.push_back(index_value);
    } else {
      // This index must not matter to resolve the type in valid SPIR-V.
      element_indices.push_back(0);
    }
  }
  type = type_mgr->GetMemberType(type, element_indices);
  return type;
}